

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readtest.c
# Opt level: O0

int main(void)

{
  int __fd;
  ssize_t sVar1;
  __off_t _Var2;
  uint local_a0;
  int numbytes;
  int i;
  int fd;
  char buf [128];
  
  __fd = open("my_test.random",0);
  if (__fd < 0) {
    perror("open my_test.random error");
    exit(1);
  }
  local_a0 = 0;
  while( true ) {
    if (999999 < (int)local_a0) {
      close(__fd);
      exit(0);
    }
    sVar1 = read(__fd,&i,0x80);
    if ((int)sVar1 < 0) break;
    if ((int)sVar1 < 0x80) {
      fprintf(_stderr,"Seek count=%d\n",(ulong)local_a0);
      _Var2 = lseek(__fd,0,0);
      if (_Var2 < 0) {
        perror("lseek");
        exit(3);
      }
    }
    local_a0 = local_a0 + 1;
  }
  perror("read");
  exit(2);
}

Assistant:

int main(){

  char buf[TEST_BUF_SIZE];
  int fd, i, numbytes;

  fd = open(FILE_NAME, O_RDONLY);
  if (fd < 0) {
    perror("open " FILE_NAME " error");
    exit(1);
  }

  /* read 1M till end of file, then seek to start */

  for (i = 0; i < MAX_READS; i++) {
    numbytes = read(fd, buf, TEST_BUF_SIZE);
    if (numbytes < 0) {
      perror("read");
      exit(2);
    }
    if (numbytes < TEST_BUF_SIZE) { /* partial read or EOF, seek to start */
      fprintf(stderr, "Seek count=%d\n", i);
      if (lseek(fd, 0, SEEK_SET) < 0) {
	perror("lseek");
	exit(3);
      }
    }
  }
  close(fd);
  exit(0);
}